

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_str.c
# Opt level: O0

adt_error_t adt_str_append_bstr(adt_str_t *self,uint8_t *pBegin,uint8_t *pEnd)

{
  adt_str_encoding_t aVar1;
  adt_error_t aVar2;
  int s32NewLen;
  int32_t newLen;
  adt_error_t result;
  int iStack_28;
  adt_str_encoding_t encoding;
  int32_t strSize;
  int32_t bufLen;
  adt_error_t retval;
  uint8_t *pEnd_local;
  uint8_t *pBegin_local;
  adt_str_t *self_local;
  
  strSize._3_1_ = '\0';
  if ((((self == (adt_str_t *)0x0) || (pBegin == (uint8_t *)0x0)) || (pEnd == (uint8_t *)0x0)) ||
     (pEnd < pBegin)) {
    strSize._3_1_ = '\x01';
    aVar2 = strSize._3_1_;
  }
  else {
    iStack_28 = (int)pEnd - (int)pBegin;
    aVar2 = strSize._3_1_;
    if (0 < iStack_28) {
      newLen = 0;
      _bufLen = pEnd;
      pEnd_local = pBegin;
      pBegin_local = (uint8_t *)self;
      aVar1 = adt_utf8_checkEncodingAndSize(pBegin,iStack_28,&newLen);
      if ((newLen < 1) || ((aVar1 != '\x01' && (aVar1 != '\x02')))) {
        if (newLen == 0) {
          strSize._3_1_ = '\0';
          aVar2 = strSize._3_1_;
        }
        else {
          strSize._3_1_ = '\a';
          aVar2 = strSize._3_1_;
        }
      }
      else {
        s32NewLen = *(int *)pBegin_local + newLen;
        aVar2 = adt_str_reserve((adt_str_t *)pBegin_local,s32NewLen);
        if (aVar2 == '\0') {
          if (*(long *)(pBegin_local + 8) == 0) {
            __assert_fail("self->pAlloc != 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/adt/src/adt_str.c"
                          ,0x19a,
                          "adt_error_t adt_str_append_bstr(adt_str_t *, const uint8_t *, const uint8_t *)"
                         );
          }
          if (*(int *)(pBegin_local + 4) <= s32NewLen) {
            __assert_fail("self->s32Size > newLen",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/adt/src/adt_str.c"
                          ,0x19b,
                          "adt_error_t adt_str_append_bstr(adt_str_t *, const uint8_t *, const uint8_t *)"
                         );
          }
          memcpy((void *)(*(long *)(pBegin_local + 8) + (long)*(int *)pBegin_local),pEnd_local,
                 (long)newLen);
          *(int *)pBegin_local = s32NewLen;
          aVar2 = strSize._3_1_;
          if ((pBegin_local[0x11] == '\x01') && (aVar1 == '\x02')) {
            pBegin_local[0x11] = '\x02';
          }
        }
      }
    }
  }
  strSize._3_1_ = aVar2;
  return strSize._3_1_;
}

Assistant:

adt_error_t adt_str_append_bstr(adt_str_t *self, const uint8_t *pBegin, const uint8_t *pEnd)
{
   adt_error_t retval = ADT_NO_ERROR;
   if( (self == 0) || (pBegin == 0) || (pEnd == 0) || (pEnd < pBegin) )
   {
      retval = ADT_INVALID_ARGUMENT_ERROR;
   }
   else
   {
      int32_t bufLen = (int32_t) (pEnd-pBegin);
      if (bufLen > 0)
      {
         int32_t strSize = 0;
         adt_str_encoding_t encoding = adt_utf8_checkEncodingAndSize(pBegin, bufLen, &strSize);
         if ( (strSize > 0) && ( (encoding == ADT_STR_ENCODING_ASCII) || (encoding == ADT_STR_ENCODING_UTF8) ) )
         {
            adt_error_t result;
            int32_t newLen;
            newLen = self->s32Cur + strSize;
            result = adt_str_reserve(self, newLen);
            if (result == ADT_NO_ERROR)
            {
               assert(self->pAlloc != 0);
               assert(self->s32Size > newLen);
               memcpy(self->pAlloc + self->s32Cur, pBegin, strSize);
               self->s32Cur = newLen;
               if ( (self->encoding == ADT_STR_ENCODING_ASCII) && (encoding == ADT_STR_ENCODING_UTF8) )
               {
                  self->encoding = encoding;
               }
            }
            else
            {
               retval = result;
            }
         }
         else if (strSize == 0)
         {
            retval = ADT_NO_ERROR;
         }
         else
         {
            retval = ADT_UNKNOWN_ENCODING_ERROR;
         }
      }
   }
   return retval;
}